

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

uchar ** traverse<vector_bagwell<unsigned_char*,16u>,void(*)(unsigned_char**,int,int),unsigned_char>
                   (TrieNode<unsigned_char> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  TrieNode<unsigned_char> *node_00;
  void *pvVar1;
  _func_void_uchar_ptr_ptr_int_int *p_Var2;
  void *pvVar3;
  size_t __n;
  _func_void_uchar_ptr_ptr_int_int *p_Var4;
  long lVar5;
  void *pvVar6;
  uint i;
  ulong uVar7;
  vector_bagwell<unsigned_char_*,_16U> *bucket;
  uchar **__dest;
  
  uVar7 = 0;
  do {
    node_00 = (TrieNode<unsigned_char> *)(node->buckets)._M_elems[uVar7];
    if (((node->is_trie).super__Base_bitset<4UL>._M_w[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
      if (node_00 != (TrieNode<unsigned_char> *)0x0) {
        pvVar3 = (node_00->buckets)._M_elems[3];
        pvVar6 = (node_00->buckets)._M_elems[0];
        pvVar1 = (node_00->buckets)._M_elems[1];
        if (pvVar3 == (void *)0x0) {
          p_Var2 = (_func_void_uchar_ptr_ptr_int_int *)0x0;
        }
        else {
          p_Var2 = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)pvVar3 +
                    ((long)((1 << ((char)((ulong)((long)pvVar1 - (long)pvVar6) >> 3) + 3U & 0x1f)) +
                           -0x10) * 8 - *(long *)((long)pvVar1 + -8)) >> 3);
        }
        small_sort = p_Var2;
        __dest = dst;
        if (8 < (ulong)((long)pvVar1 - (long)pvVar6)) {
          lVar5 = 0x10;
          p_Var4 = (_func_void_uchar_ptr_ptr_int_int *)0x1;
          do {
            if (lVar5 != 0) {
              memmove(__dest,*(void **)((long)pvVar6 + (long)p_Var4 * 8 + -8),lVar5 * 8);
              pvVar6 = (node_00->buckets)._M_elems[0];
              pvVar1 = (node_00->buckets)._M_elems[1];
            }
            __dest = __dest + lVar5;
            lVar5 = lVar5 * 2;
            p_Var4 = p_Var4 + 1;
            small_sort = (_func_void_uchar_ptr_ptr_int_int *)((long)pvVar1 - (long)pvVar6 >> 3);
          } while (p_Var4 < small_sort);
          pvVar3 = (node_00->buckets)._M_elems[3];
        }
        __n = (long)pvVar3 - (long)*(void **)((long)pvVar1 + -8);
        if (__n != 0) {
          memmove(__dest,*(void **)((long)pvVar1 + -8),__n);
        }
        if (uVar7 != 0) {
          mkqsort(dst,(int)p_Var2,(int)depth);
        }
        dst = dst + (long)p_Var2;
        vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell
                  ((vector_bagwell<unsigned_char_*,_16U> *)node_00);
        operator_delete(node_00);
      }
    }
    else {
      dst = traverse<vector_bagwell<unsigned_char*,16u>,void(*)(unsigned_char**,int,int),unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x100);
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}